

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

int __thiscall
array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>::insert
          (array<CLocalizationDatabase::CString,_allocator_default<CLocalizationDatabase::CString>_>
           *this,CString *item,range r)

{
  long lVar1;
  CString *pCVar2;
  int iVar3;
  CString *pCVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  range r_local;
  
  r_local.end = r.end;
  r_local.begin = r.begin;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (r_local.begin < r_local.end) {
    pCVar4 = plain_range<CLocalizationDatabase::CString>::front(&r_local);
    pCVar2 = this->list;
    incsize(this);
    set_size(this,this->num_elements + 1);
    lVar6 = (long)this->num_elements;
    iVar3 = (int)(((long)pCVar4 - (long)pCVar2) / 0x18);
    lVar5 = lVar6 * 0x18 + -0x30;
    while( true ) {
      lVar6 = lVar6 + -1;
      pCVar2 = this->list;
      if (lVar6 <= iVar3) break;
      CLocalizationDatabase::CString::operator=
                ((CString *)((long)&pCVar2[1].m_Hash + lVar5),
                 (CString *)((long)&pCVar2->m_Hash + lVar5));
      lVar5 = lVar5 + -0x18;
    }
    CLocalizationDatabase::CString::operator=(pCVar2 + iVar3,item);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return this->num_elements + -1;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3 = add(this,item);
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}